

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_Model::ValdateComponentIdAndName
          (ONX_Model *this,Type component_type,ON_UUID *candidate_id,ON_UUID *component_parent_id,
          wchar_t *candidate_name,bool bResolveIdConflict,bool bResolveNameConflict,
          ON_UUID *model_id,ON_wString *model_name)

{
  uchar auVar1 [8];
  wchar_t *candidate_name_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  wchar_t *suffix_separator;
  byte bVar5;
  char *sFormat;
  ON_UUID *pOVar6;
  char cVar7;
  int line_number;
  ON_ComponentManifest *this_00;
  ON_UUID OVar8;
  ON_wString name;
  ON_NameHash local_a0;
  ON_NameHash name_hash;
  ON_UUID name_parent_id;
  
  bVar2 = ON_ModelComponent::ComponentTypeIsValid(component_type);
  if (bVar2) {
    bVar2 = ON_ModelComponent::IndexRequired(component_type);
    this_00 = &this->m_manifest;
    uVar4 = ON_ComponentManifest::ComponentIndexLimit(this_00,component_type);
    if ((!bVar2) || (uVar4 < 0x7fffffff)) {
      bVar2 = ON_ComponentManifest::IdIsAvailable(this_00,*candidate_id);
      bVar3 = ON_UuidIsNil(candidate_id);
      bVar5 = 1;
      if (!bVar3) {
        bVar5 = ~bVar2 & bResolveIdConflict;
      }
      if ((bVar2 | bVar5) != 1) goto LAB_00464baf;
      ON_wString::ON_wString(&name,candidate_name);
      ON_wString::TrimLeftAndRight(&name,(wchar_t *)0x0);
      bVar2 = ON_ModelComponent::UniqueNameRequired(component_type);
      if (bVar2) {
        bVar2 = ON_ModelComponent::UniqueNameIncludesParent(component_type);
        pOVar6 = component_parent_id;
        if (!bVar2) {
          pOVar6 = &ON_nil_uuid;
        }
        name_parent_id.Data1 = pOVar6->Data1;
        name_parent_id.Data2 = pOVar6->Data2;
        name_parent_id.Data3 = pOVar6->Data3;
        name_parent_id.Data4 = *&pOVar6->Data4;
        ON_NameHash::Create(&name_hash,&name_parent_id,&name);
        bVar2 = ON_NameHash::IsInvalidNameHash(&name_hash);
        if (bVar2) {
          if (bResolveNameConflict) {
            ON_wString::operator=(&name,&ON_wString::EmptyString);
            ON_NameHash::Create(&local_a0,&name_parent_id,&name);
            name_hash.m_parent_id.Data4[0] = local_a0.m_parent_id.Data4[0];
            name_hash.m_parent_id.Data4[1] = local_a0.m_parent_id.Data4[1];
            name_hash.m_parent_id.Data4[2] = local_a0.m_parent_id.Data4[2];
            name_hash.m_parent_id.Data4[3] = local_a0.m_parent_id.Data4[3];
            name_hash.m_parent_id.Data4[4] = local_a0.m_parent_id.Data4[4];
            name_hash.m_parent_id.Data4[5] = local_a0.m_parent_id.Data4[5];
            name_hash.m_parent_id.Data4[6] = local_a0.m_parent_id.Data4[6];
            name_hash.m_parent_id.Data4[7] = local_a0.m_parent_id.Data4[7];
            name_hash.m_sha1_hash.m_digest[0xc] = local_a0.m_sha1_hash.m_digest[0xc];
            name_hash.m_sha1_hash.m_digest[0xd] = local_a0.m_sha1_hash.m_digest[0xd];
            name_hash.m_sha1_hash.m_digest[0xe] = local_a0.m_sha1_hash.m_digest[0xe];
            name_hash.m_sha1_hash.m_digest[0xf] = local_a0.m_sha1_hash.m_digest[0xf];
            name_hash.m_sha1_hash.m_digest[0x10] = local_a0.m_sha1_hash.m_digest[0x10];
            name_hash.m_sha1_hash.m_digest[0x11] = local_a0.m_sha1_hash.m_digest[0x11];
            name_hash.m_sha1_hash.m_digest[0x12] = local_a0.m_sha1_hash.m_digest[0x12];
            name_hash.m_sha1_hash.m_digest[0x13] = local_a0.m_sha1_hash.m_digest[0x13];
            name_hash.m_parent_id.Data1 = local_a0.m_parent_id.Data1;
            name_hash.m_parent_id.Data2 = local_a0.m_parent_id.Data2;
            name_hash.m_parent_id.Data3 = local_a0.m_parent_id.Data3;
            name_hash.m_flags = local_a0.m_flags;
            name_hash.m_sha1_hash.m_digest[0] = local_a0.m_sha1_hash.m_digest[0];
            name_hash.m_sha1_hash.m_digest[1] = local_a0.m_sha1_hash.m_digest[1];
            name_hash.m_sha1_hash.m_digest[2] = local_a0.m_sha1_hash.m_digest[2];
            name_hash.m_sha1_hash.m_digest[3] = local_a0.m_sha1_hash.m_digest[3];
            name_hash.m_sha1_hash.m_digest[4] = local_a0.m_sha1_hash.m_digest[4];
            name_hash.m_sha1_hash.m_digest[5] = local_a0.m_sha1_hash.m_digest[5];
            name_hash.m_sha1_hash.m_digest[6] = local_a0.m_sha1_hash.m_digest[6];
            name_hash.m_sha1_hash.m_digest[7] = local_a0.m_sha1_hash.m_digest[7];
            name_hash.m_sha1_hash.m_digest[8] = local_a0.m_sha1_hash.m_digest[8];
            name_hash.m_sha1_hash.m_digest[9] = local_a0.m_sha1_hash.m_digest[9];
            name_hash.m_sha1_hash.m_digest[10] = local_a0.m_sha1_hash.m_digest[10];
            name_hash.m_sha1_hash.m_digest[0xb] = local_a0.m_sha1_hash.m_digest[0xb];
            goto LAB_00464cdc;
          }
          cVar7 = '\x02';
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                     ,0x26f,"","Invalid candidate_name parameter.");
        }
        else {
LAB_00464cdc:
          bVar2 = ON_wString::IsNotEmpty(&name);
          if (bVar2) {
            bVar2 = ON_ComponentManifest::NameIsAvailable(this_00,component_type,&name_hash);
            if (bResolveNameConflict && !bVar2) {
LAB_00464d1c:
              auVar1 = *(uchar (*) [8])component_parent_id;
              candidate_name_00 = *(wchar_t **)component_parent_id->Data4;
              suffix_separator = ON_wString::operator_cast_to_wchar_t_(&name);
              OVar8._1_7_ = 0;
              OVar8.Data1._0_1_ = component_type;
              OVar8.Data4 = auVar1;
              ON_ComponentManifest::UnusedName
                        ((ON_ComponentManifest *)&local_a0,(Type)this_00,OVar8,candidate_name_00,
                         (wchar_t *)0x0,suffix_separator,0,(uint *)0xffffffffffffffff);
              ON_wString::operator=(&name,(ON_wString *)&local_a0);
              ON_wString::~ON_wString((ON_wString *)&local_a0);
              bVar2 = ON_wString::IsEmpty(&name);
              cVar7 = '\0';
              if (bVar2) {
                cVar7 = '\x02';
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                           ,0x283,"","Unable to create component name.");
              }
            }
            else {
              cVar7 = !bVar2 * '\x02';
            }
          }
          else {
            cVar7 = '\x02';
            if (bResolveNameConflict) goto LAB_00464d1c;
          }
        }
        if (cVar7 == '\0') goto LAB_00464dd3;
      }
      else {
LAB_00464dd3:
        if (bVar5 == 0) {
          OVar8 = *candidate_id;
        }
        else {
          OVar8 = ON_CreateId();
        }
        *model_id = OVar8;
        cVar7 = '\x01';
        ON_wString::operator=(model_name,&name);
      }
      ON_wString::~ON_wString(&name);
      if (cVar7 != '\x02') {
        return true;
      }
      goto LAB_00464baf;
    }
    sFormat = "Unable to create model component index.";
    line_number = 0x256;
  }
  else {
    sFormat = "Invalid component_type parameter.";
    line_number = 0x24e;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,line_number,"",sFormat);
LAB_00464baf:
  model_id->Data1 = 0;
  model_id->Data2 = 0;
  model_id->Data3 = 0;
  model_id->Data4[0] = '\0';
  model_id->Data4[1] = '\0';
  model_id->Data4[2] = '\0';
  model_id->Data4[3] = '\0';
  model_id->Data4[4] = '\0';
  model_id->Data4[5] = '\0';
  model_id->Data4[6] = '\0';
  model_id->Data4[7] = '\0';
  ON_wString::operator=(model_name,&ON_wString::EmptyString);
  return false;
}

Assistant:

bool ONX_Model::ValdateComponentIdAndName(
  ON_ModelComponent::Type component_type,
  const ON_UUID& candidate_id,
  const ON_UUID& component_parent_id,
  const wchar_t* candidate_name,
  bool bResolveIdConflict,
  bool bResolveNameConflict,
  ON_UUID& model_id,
  ON_wString& model_name
  ) const
{
  for (;;)
  {
    if (false == ON_ModelComponent::ComponentTypeIsValid(component_type))
    {
      ON_ERROR("Invalid component_type parameter.");
      break;
    }

    const bool bIndexRequired = ON_ModelComponent::IndexRequired(component_type);
    const unsigned int count = m_manifest.ComponentIndexLimit(component_type);
    if (bIndexRequired && count >= 0x7FFFFFFFU)
    {
      ON_ERROR("Unable to create model component index.");
      break;
    }
    
    const bool bIdAvailable = m_manifest.IdIsAvailable(candidate_id);
    const bool bCreateId = ON_UuidIsNil(candidate_id) || (false == bIdAvailable && bResolveIdConflict);
    if (false == bIdAvailable && false == bCreateId)
    {
      break;
    }

    ON_wString name(candidate_name);
    name.TrimLeftAndRight();
    const bool bUniqueNameReqired = ON_ModelComponent::UniqueNameRequired(component_type);
    if ( bUniqueNameReqired )
    {
      const ON_UUID name_parent_id
        = ON_ModelComponent::UniqueNameIncludesParent(component_type)
        ? component_parent_id
        : ON_nil_uuid;
      ON_NameHash name_hash = ON_NameHash::Create(name_parent_id, name);
      if (name_hash.IsInvalidNameHash())
      {
        if (false == bResolveNameConflict)
        {
          ON_ERROR("Invalid candidate_name parameter.");
          break;
        }
        name = ON_wString::EmptyString;
        name_hash = ON_NameHash::Create(name_parent_id, name);
      }

      const bool bNameIsValid = name.IsNotEmpty() && m_manifest.NameIsAvailable(component_type, name_hash);
      if (false == bNameIsValid )
      {
        // we need to create a unique and non-empty name
        if (false == bResolveNameConflict)
        {
          // not allowed to modify name
          break;
        }

        name = m_manifest.UnusedName(component_type, component_parent_id, nullptr, name, nullptr, ON_UNSET_UINT_INDEX, nullptr);
        if (name.IsEmpty())
        {
          ON_ERROR("Unable to create component name.");
          break;
        }
      }
    }

    model_id = bCreateId ? ON_CreateId() : candidate_id;
    model_name = name;
    return true;
  }

  model_id = ON_nil_uuid;
  model_name = ON_wString::EmptyString;
  return false;
}